

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

libcaption_stauts_t sei_from_scc(sei_t *sei,scc_t *scc)

{
  long in_RSI;
  cea708_t cea708;
  uint i;
  double in_stack_ffffffffffffff48;
  cea708_t *in_stack_ffffffffffffff50;
  ushort in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff5a;
  sei_t *in_stack_ffffffffffffff60;
  uint local_14;
  
  cea708_init(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  for (local_14 = 0; local_14 < *(uint *)(in_RSI + 0xc); local_14 = local_14 + 1) {
    if ((in_stack_ffffffffffffff58 >> 3 & 0x1f) == 0x1f) {
      sei_append_708(in_stack_ffffffffffffff60,
                     (cea708_t *)CONCAT62(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58));
    }
    cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff48,1,cc_type_ntsc_cc_field_1,
                       *(uint16_t *)(in_RSI + 0x10 + (ulong)local_14 * 2));
  }
  if ((in_stack_ffffffffffffff58 >> 3 & 0x1f) != 0) {
    sei_append_708(in_stack_ffffffffffffff60,
                   (cea708_t *)CONCAT62(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58));
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t sei_from_scc(sei_t* sei, const scc_t* scc)
{
    unsigned int i;
    cea708_t cea708;
    cea708_init(&cea708, sei->timestamp); // set up a new popon frame

    for (i = 0; i < scc->cc_size; ++i) {
        if (31 == cea708.user_data.cc_count) {
            sei_append_708(sei, &cea708);
        }

        cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, scc->cc_data[i]);
    }

    if (0 != cea708.user_data.cc_count) {
        sei_append_708(sei, &cea708);
    }

    return LIBCAPTION_OK;
}